

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_phase_callback_registry.cpp
# Opt level: O0

mask_type __thiscall
sc_core::sc_phase_callback_registry::register_callback
          (sc_phase_callback_registry *this,cb_type *cb,mask_type m)

{
  __normal_iterator<sc_core::sc_phase_callback_registry::entry_*,_std::vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>_>
  __first;
  bool bVar1;
  reference peVar2;
  cb_type *in_RSI;
  value_type *in_RDI;
  entry new_entry;
  mask_type new_mask;
  mask_type diff_mask;
  iterator it;
  undefined1 in_stack_00000703;
  mask_type in_stack_00000704;
  cb_type *in_stack_00000708;
  sc_phase_callback_registry *in_stack_00000710;
  vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>
  *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar3;
  vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_> *in_stack_ffffffffffffff90;
  entry_match in_stack_ffffffffffffff98;
  __normal_iterator<sc_core::sc_phase_callback_registry::entry_*,_std::vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>_>
  in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  mask_type local_48;
  uint local_44;
  entry_match local_40;
  entry *local_38;
  entry *local_30;
  __normal_iterator<sc_core::sc_phase_callback_registry::entry_*,_std::vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>_>
  local_28;
  mask_type local_1c;
  cb_type *local_18;
  
  local_18 = in_RSI;
  local_30 = (entry *)std::
                      vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>
                      ::begin(in_stack_ffffffffffffff78);
  local_38 = (entry *)std::
                      vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>
                      ::end(in_stack_ffffffffffffff78);
  anon_unknown_5::entry_match::entry_match(&local_40,local_18);
  __first._M_current._4_4_ = in_stack_ffffffffffffffac;
  __first._M_current._0_4_ = in_stack_ffffffffffffffa8;
  local_28 = std::
             find_if<__gnu_cxx::__normal_iterator<sc_core::sc_phase_callback_registry::entry*,std::vector<sc_core::sc_phase_callback_registry::entry,std::allocator<sc_core::sc_phase_callback_registry::entry>>>,sc_core::(anonymous_namespace)::entry_match>
                       (__first,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_48 = validate_mask(in_stack_00000710,in_stack_00000708,in_stack_00000704,
                           (bool)in_stack_00000703);
  local_1c = local_48;
  std::
  vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>
  ::end(in_stack_ffffffffffffff78);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<sc_core::sc_phase_callback_registry::entry_*,_std::vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (__normal_iterator<sc_core::sc_phase_callback_registry::entry_*,_std::vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>_>
                      *)in_stack_ffffffffffffff78);
  if (bVar1) {
    peVar2 = __gnu_cxx::
             __normal_iterator<sc_core::sc_phase_callback_registry::entry_*,_std::vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>_>
             ::operator*(&local_28);
    local_48 = peVar2->mask | local_1c;
    peVar2 = __gnu_cxx::
             __normal_iterator<sc_core::sc_phase_callback_registry::entry_*,_std::vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>_>
             ::operator*(&local_28);
    local_44 = (peVar2->mask ^ 0xffffffff) & local_1c;
    uVar3 = local_48;
    peVar2 = __gnu_cxx::
             __normal_iterator<sc_core::sc_phase_callback_registry::entry_*,_std::vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>_>
             ::operator*(&local_28);
    peVar2->mask = uVar3;
  }
  else {
    if (local_1c == 0) {
      return 0;
    }
    std::
    vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>
    ::push_back((vector<sc_core::sc_phase_callback_registry::entry,_std::allocator<sc_core::sc_phase_callback_registry::entry>_>
                 *)in_stack_ffffffffffffff90,in_RDI);
    local_44 = local_48;
  }
  if ((local_44 & 0x400) != 0) {
    std::vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>::push_back
              (in_stack_ffffffffffffff90,&in_RDI->target);
  }
  if ((local_44 & 0x800) != 0) {
    std::vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>::push_back
              ((vector<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_> *)local_18,
               &in_RDI->target);
  }
  return local_48;
}

Assistant:

sc_phase_callback_registry::mask_type
sc_phase_callback_registry::register_callback( cb_type& cb, mask_type m )
{
    storage_type::iterator it =
      find_if( m_cb_vec.begin(), m_cb_vec.end(), entry_match(&cb) );

    m = validate_mask(cb, m, /* warn */ true );

    mask_type diff_mask = m;
    mask_type new_mask  = m;

    if( it != m_cb_vec.end() ) // update existing entry
    {
        // update masks
        new_mask   =  (*it).mask | m;
        diff_mask  = ~(*it).mask & m;
        (*it).mask = new_mask;
    }
    else // new entry
    {
        if( !m ) // empty, do nothing
            return SC_UNITIALIZED;

        entry new_entry = { &cb, new_mask };
        m_cb_vec.push_back( new_entry );
    }

    // add to callback shortcut sets
#if 0
    if( diff_mask & SC_END_OF_EVALUATION )
        m_cb_eval_vec.push_back( &cb );
#endif
    if( diff_mask & SC_END_OF_UPDATE )
        m_cb_update_vec.push_back( &cb );
    if( diff_mask & SC_BEFORE_TIMESTEP )
        m_cb_timestep_vec.push_back( &cb );

    return new_mask;
}